

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::imageAtomicExtensionShaderRequires_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,RenderContext *renderContext)

{
  bool bVar1;
  ContextType ctxType;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this + 0x10))(this);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_OES_shader_image_atomic",&local_51);
    std::operator+(&local_50,"#extension ",&local_30);
    std::operator+(__return_storage_ptr__,&local_50," : require\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string imageAtomicExtensionShaderRequires (const RenderContext& renderContext)
{
	if (!glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)))
		return "#extension " + string(s_imageAtomicExtString) + " : require\n";
	else
		return "";
}